

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void testConsumeComment(void)

{
  long lVar1;
  string commentDescriptor;
  string result;
  string emptyString;
  regex pattern;
  Node node;
  stringstream buffer;
  ifstream file;
  long *local_4d8 [2];
  long local_4c8 [2];
  undefined1 *local_4b8;
  undefined8 local_4b0;
  undefined1 local_4a8;
  undefined7 uStack_4a7;
  char *local_498;
  size_t local_490;
  char local_488;
  undefined7 uStack_487;
  string local_478;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_458;
  undefined1 local_438 [32];
  _Variant_storage<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_418;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3b8;
  stringstream local_3b0 [16];
  ostream local_3a0 [112];
  ios_base local_330 [264];
  undefined1 local_228 [16];
  streambuf local_218 [504];
  
  std::ifstream::ifstream(local_228,"source/commentTest.html",_S_in);
  std::__cxx11::stringstream::stringstream(local_3b0);
  std::ostream::operator<<(local_3a0,local_218);
  local_490 = 0;
  local_488 = '\0';
  local_498 = &local_488;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_458,"<!--.*?-->",0x10);
  std::__cxx11::stringbuf::str();
  local_4b0 = 0;
  local_4a8 = 0;
  local_4b8 = &local_4a8;
  std::
  __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4b8,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_438._0_8_,
             (char *)(local_438._0_8_ +
                     (long)(vector<crawler::Node,_std::allocator<crawler::Node>_> *)local_438._8_8_)
             ,&local_458,local_498,local_490,0);
  if ((pointer)local_438._0_8_ != (pointer)(local_438 + 0x10)) {
    operator_delete((void *)local_438._0_8_,
                    (ulong)((long)&(((vector<crawler::Node,_std::allocator<crawler::Node>_> *)
                                    local_438._16_8_)->
                                   super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>
                                   )._M_impl.super__Vector_impl_data._M_start + 1));
  }
  local_4d8[0] = local_4c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,"<!--","");
  test_count = test_count + 1;
  lVar1 = std::__cxx11::string::find((char *)&local_4b8,(ulong)local_4d8[0],0);
  if (lVar1 == -1) {
    test_pass = test_pass + 1;
  }
  else {
    testConsumeComment();
  }
  std::__cxx11::stringbuf::str();
  crawler::parse((Node *)local_438,&local_478);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
  printNode((Node *)local_438);
  if (local_3b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b8._M_pi);
  }
  std::__detail::__variant::
  _Variant_storage<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage(&local_418);
  std::vector<crawler::Node,_std::allocator<crawler::Node>_>::~vector
            ((vector<crawler::Node,_std::allocator<crawler::Node>_> *)local_438);
  if (local_4d8[0] != local_4c8) {
    operator_delete(local_4d8[0],local_4c8[0] + 1);
  }
  if (local_4b8 != &local_4a8) {
    operator_delete(local_4b8,CONCAT71(uStack_4a7,local_4a8) + 1);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_458);
  if (local_498 != &local_488) {
    operator_delete(local_498,CONCAT71(uStack_487,local_488) + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_3b0);
  std::ios_base::~ios_base(local_330);
  std::ifstream::~ifstream(local_228);
  return;
}

Assistant:

void testConsumeComment() {
  std::ifstream file("source/commentTest.html");
  std::stringstream buffer;
  buffer << file.rdbuf();
  std::string emptyString;
  std::regex pattern(R"(<!--.*?-->)");
  std::string result = std::regex_replace(buffer.str(), pattern, emptyString);
  std::string commentDescriptor("<!--");
  ASSERT_TRUE(!crawler::contains(commentDescriptor, result));
  crawler::Node node = crawler::parse(buffer.str());
  printNode(node);
}